

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::blueprint_helpers::parseFracSigOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  char16_t cVar1;
  int32_t iVar2;
  Precision *this;
  uint index;
  uint maxSignificantDigits;
  uint index_00;
  Precision local_50;
  
  index_00 = 0;
  cVar1 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar1 != L'@') goto LAB_0026546c;
  iVar2 = numparse::impl::StringSegment::length(segment);
  if (0 < iVar2) {
    index_00 = 0;
    do {
      cVar1 = numparse::impl::StringSegment::charAt(segment,index_00);
      if (cVar1 != L'@') break;
      index_00 = index_00 + 1;
      iVar2 = numparse::impl::StringSegment::length(segment);
    } while ((int)index_00 < iVar2);
  }
  iVar2 = numparse::impl::StringSegment::length(segment);
  if ((int)index_00 < iVar2) {
    cVar1 = numparse::impl::StringSegment::charAt(segment,index_00);
    if (cVar1 == L'+') {
      index = index_00 + 1;
      maxSignificantDigits = 0xffffffff;
    }
    else {
      if (1 < index_00) goto LAB_00265462;
      iVar2 = numparse::impl::StringSegment::length(segment);
      index = index_00;
      maxSignificantDigits = index_00;
      if ((int)index_00 < iVar2) {
        do {
          cVar1 = numparse::impl::StringSegment::charAt(segment,index);
          maxSignificantDigits = index;
          if (cVar1 != L'#') break;
          index = index + 1;
          iVar2 = numparse::impl::StringSegment::length(segment);
          maxSignificantDigits = index;
        } while ((int)index < iVar2);
      }
    }
    iVar2 = numparse::impl::StringSegment::length(segment);
    if (iVar2 <= (int)index) {
      this = &macros->precision;
      if (maxSignificantDigits == 0xffffffff) {
        FractionPrecision::withMinDigits(&local_50,(FractionPrecision *)this,index_00);
      }
      else {
        FractionPrecision::withMaxDigits(&local_50,(FractionPrecision *)this,maxSignificantDigits);
      }
      *(undefined4 *)((long)&(macros->precision).fUnion + 4) = local_50.fUnion._4_4_;
      *(undefined4 *)((long)&(macros->precision).fUnion + 8) = local_50.fUnion._8_4_;
      *(undefined4 *)((long)&(macros->precision).fUnion + 0xc) = local_50.fUnion._12_4_;
      (macros->precision).fRoundingMode = local_50.fRoundingMode;
      this->fType = local_50.fType;
      *(undefined4 *)&(macros->precision).field_0x4 = local_50._4_4_;
      (macros->precision).fUnion.currencyUsage = local_50.fUnion.currencyUsage;
      *(undefined4 *)((long)&(macros->precision).fUnion + 4) = local_50.fUnion._4_4_;
      index_00 = 1;
      goto LAB_0026546c;
    }
  }
LAB_00265462:
  *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  index_00 = 0;
LAB_0026546c:
  return SUB41(index_00,0);
}

Assistant:

bool blueprint_helpers::parseFracSigOption(const StringSegment& segment, MacroProps& macros,
                                           UErrorCode& status) {
    if (segment.charAt(0) != u'@') {
        return false;
    }
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    // For the frac-sig option, there must be minSig or maxSig but not both.
    // Valid: @+, @@+, @@@+
    // Valid: @#, @##, @###
    // Invalid: @, @@, @@@
    // Invalid: @@#, @@##, @@@#
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else if (minSig > 1) {
            // @@#, @@##, @@@#
            // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
            status = U_NUMBER_SKELETON_SYNTAX_ERROR;
            return false;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        // @, @@, @@@
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid digits option for fraction rounder", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return false;
    }

    auto& oldPrecision = static_cast<const FractionPrecision&>(macros.precision);
    if (maxSig == -1) {
        macros.precision = oldPrecision.withMinDigits(minSig);
    } else {
        macros.precision = oldPrecision.withMaxDigits(maxSig);
    }
    return true;
}